

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::RelaxFloatOpsPass::IsRelaxed(RelaxFloatOpsPass *this,uint32_t r_id)

{
  uint32_t uVar1;
  DecorationManager *this_00;
  pointer ppIVar2;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_30
  ;
  
  this_00 = Pass::get_decoration_mgr(&this->super_Pass);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_30,this_00,r_id,false);
  for (ppIVar2 = local_30._M_impl.super__Vector_impl_data._M_start;
      ppIVar2 != local_30._M_impl.super__Vector_impl_data._M_finish; ppIVar2 = ppIVar2 + 1) {
    if ((*ppIVar2)->opcode_ == OpDecorate) {
      uVar1 = Instruction::GetSingleWordInOperand(*ppIVar2,1);
      if (uVar1 == 0) break;
    }
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_30);
  return ppIVar2 != local_30._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool RelaxFloatOpsPass::IsRelaxed(uint32_t r_id) {
  for (auto r_inst : get_decoration_mgr()->GetDecorationsFor(r_id, false))
    if (r_inst->opcode() == spv::Op::OpDecorate &&
        spv::Decoration(r_inst->GetSingleWordInOperand(1)) ==
            spv::Decoration::RelaxedPrecision)
      return true;
  return false;
}